

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk_info.cpp
# Opt level: O1

idx_t __thiscall
duckdb::ChunkVectorInfo::Delete
          (ChunkVectorInfo *this,transaction_t transaction_id,row_t *rows,idx_t count)

{
  idx_t iVar1;
  TransactionException *this_00;
  idx_t iVar2;
  string local_40;
  
  this->any_deleted = true;
  if (count == 0) {
    iVar1 = 0;
  }
  else {
    iVar2 = 0;
    iVar1 = 0;
    do {
      if (this->deleted[rows[iVar2]] != transaction_id) {
        if (this->deleted[rows[iVar2]] != 0xfffffffffffffffe) {
          if (iVar2 != 0) {
            iVar1 = 0;
            do {
              this->deleted[rows[iVar1]] = 0xfffffffffffffffe;
              iVar1 = iVar1 + 1;
            } while (iVar2 != iVar1);
          }
          this_00 = (TransactionException *)__cxa_allocate_exception(0x10);
          local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_40,"Conflict on tuple deletion!","");
          TransactionException::TransactionException(this_00,&local_40);
          __cxa_throw(this_00,&TransactionException::typeinfo,::std::runtime_error::~runtime_error);
        }
        this->deleted[rows[iVar2]] = transaction_id;
        rows[iVar1] = rows[iVar2];
        iVar1 = iVar1 + 1;
      }
      iVar2 = iVar2 + 1;
    } while (count != iVar2);
  }
  return iVar1;
}

Assistant:

idx_t ChunkVectorInfo::Delete(transaction_t transaction_id, row_t rows[], idx_t count) {
	any_deleted = true;

	idx_t deleted_tuples = 0;
	for (idx_t i = 0; i < count; i++) {
		if (deleted[rows[i]] == transaction_id) {
			continue;
		}
		// first check the chunk for conflicts
		if (deleted[rows[i]] != NOT_DELETED_ID) {
			// tuple was already deleted by another transaction - conflict
			// unset any deleted tuples we set in this loop
			for (idx_t k = 0; k < i; k++) {
				deleted[rows[k]] = NOT_DELETED_ID;
			}
			throw TransactionException("Conflict on tuple deletion!");
		}
		// after verifying that there are no conflicts we mark the tuple as deleted
		deleted[rows[i]] = transaction_id;
		rows[deleted_tuples] = rows[i];
		deleted_tuples++;
	}
	return deleted_tuples;
}